

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O1

void * large_ralloc(tsdn_t *tsdn,arena_t *arena,void *ptr,size_t usize,size_t alignment,_Bool zero,
                   tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  int iVar3;
  void *ptr_00;
  rtree_leaf_elm_t *prVar4;
  void *pvVar5;
  cache_bin_info_t *pcVar6;
  _Bool _Var7;
  uint uVar8;
  szind_t binind;
  rtree_leaf_elm_t *prVar9;
  void *result;
  size_t alignment_00;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  rtree_ctx_cache_elm_t *prVar13;
  rtree_ctx_cache_elm_t *prVar14;
  rtree_ctx_t *prVar15;
  extent_t *extent;
  rtree_leaf_elm_t *prVar16;
  bool bVar17;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    prVar15 = &rtree_ctx_fallback;
    rtree_ctx_data_init(prVar15);
  }
  else {
    prVar15 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar9 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar11 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&prVar15->cache[0].leafkey + uVar11);
  prVar16 = *(rtree_leaf_elm_t **)((long)&prVar15->cache[0].leafkey + uVar11);
  if (prVar16 == prVar9) {
    prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar15->l2_cache[0].leafkey == prVar9) {
    prVar4 = prVar15->l2_cache[0].leaf;
    prVar15->l2_cache[0].leafkey = (uintptr_t)prVar16;
    prVar15->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar9;
    puVar2[1] = (ulong)prVar4;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar13 = prVar15->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar15->l2_cache[1].leafkey == prVar9) {
      uVar12 = 0;
      bVar17 = false;
    }
    else {
      uVar11 = 1;
      prVar14 = prVar13;
      do {
        uVar12 = uVar11;
        bVar17 = 6 < uVar12;
        if (uVar12 == 7) goto LAB_001157b6;
        prVar13 = prVar14 + 1;
        prVar1 = prVar14 + 1;
        uVar11 = uVar12 + 1;
        prVar14 = prVar13;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar9);
      bVar17 = 6 < uVar12;
    }
    prVar4 = prVar13->leaf;
    prVar13->leafkey = prVar15->l2_cache[uVar12].leafkey;
    prVar13->leaf = prVar15->l2_cache[uVar12].leaf;
    prVar15->l2_cache[uVar12].leafkey = (uintptr_t)prVar16;
    prVar15->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar9;
    puVar2[1] = (ulong)prVar4;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_001157b6:
    if (bVar17) {
      prVar9 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,prVar15,(uintptr_t)ptr,true,false);
    }
  }
  extent = (extent_t *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  uVar11 = *(ulong *)((long)sz_index2size_tab + (ulong)((uint)extent->e_bits >> 0xf & 0x7f8));
  _Var7 = large_ralloc_no_move(tsdn,extent,usize,usize,zero);
  if (!_Var7) {
    hook_invoke_expand(hook_args->is_realloc ^ hook_expand_rallocx,ptr,uVar11,usize,(uintptr_t)ptr,
                       hook_args->args);
    return extent->e_addr;
  }
  alignment_00 = 0x40;
  if (0x40 < alignment) {
    alignment_00 = alignment;
  }
  result = large_palloc(tsdn,arena,usize,alignment_00,zero);
  if (result == (void *)0x0) {
    return (void *)0x0;
  }
  hook_invoke_alloc(hook_alloc_rallocx - hook_args->is_realloc,result,(uintptr_t)result,
                    hook_args->args);
  hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (uVar11 < usize) {
    usize = uVar11;
  }
  memcpy(result,extent->e_addr,usize);
  ptr_00 = extent->e_addr;
  if (tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache(tsdn,ptr_00,uVar11);
    return result;
  }
  if (uVar11 < 0x1001) {
    binind = (szind_t)sz_size2index_tab[uVar11 + 7 >> 3];
  }
  else {
    binind = sz_size2index_compute(uVar11);
  }
  if (0x23 < binind) {
    if (nhbins <= binind) {
      if (tsdn == (tsdn_t *)0x0) {
        prVar15 = &rtree_ctx_fallback;
        rtree_ctx_data_init(prVar15);
      }
      else {
        prVar15 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      pvVar10 = (void *)((ulong)ptr_00 & 0xffffffffc0000000);
      uVar11 = (ulong)(((uint)((ulong)ptr_00 >> 0x1e) & 0xf) << 4);
      prVar16 = (rtree_leaf_elm_t *)((long)&prVar15->cache[0].leafkey + uVar11);
      pvVar5 = *(void **)((long)&prVar15->cache[0].leafkey + uVar11);
      if (pvVar5 == pvVar10) {
        prVar16 = (rtree_leaf_elm_t *)
                  ((ulong)((uint)((ulong)ptr_00 >> 9) & 0x1ffff8) + (long)prVar16[1].le_bits.repr);
      }
      else if ((void *)prVar15->l2_cache[0].leafkey == pvVar10) {
        prVar9 = prVar15->l2_cache[0].leaf;
        prVar15->l2_cache[0].leafkey = (uintptr_t)pvVar5;
        prVar15->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar16[1].le_bits.repr;
        (prVar16->le_bits).repr = pvVar10;
        prVar16[1].le_bits.repr = prVar9;
        prVar16 = (rtree_leaf_elm_t *)
                  ((long)&(prVar9->le_bits).repr + (ulong)((uint)ptr_00 >> 9 & 0x1ffff8));
      }
      else {
        prVar13 = prVar15->l2_cache + 1;
        if ((void *)prVar15->l2_cache[1].leafkey == pvVar10) {
          uVar12 = 0;
          bVar17 = false;
        }
        else {
          uVar11 = 1;
          prVar14 = prVar13;
          do {
            uVar12 = uVar11;
            bVar17 = 6 < uVar12;
            if (uVar12 == 7) goto LAB_001158fd;
            prVar13 = prVar14 + 1;
            prVar1 = prVar14 + 1;
            uVar11 = uVar12 + 1;
            prVar14 = prVar13;
          } while ((void *)prVar1->leafkey != pvVar10);
          bVar17 = 6 < uVar12;
        }
        prVar9 = prVar13->leaf;
        prVar13->leafkey = prVar15->l2_cache[uVar12].leafkey;
        prVar13->leaf = prVar15->l2_cache[uVar12].leaf;
        prVar15->l2_cache[uVar12].leafkey = (uintptr_t)pvVar5;
        prVar15->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)prVar16[1].le_bits.repr;
        (prVar16->le_bits).repr = pvVar10;
        prVar16[1].le_bits.repr = prVar9;
        prVar16 = (rtree_leaf_elm_t *)
                  ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)ptr_00 >> 9) & 0x1ffff8));
LAB_001158fd:
        if (bVar17) {
          prVar16 = rtree_leaf_elm_lookup_hard
                              (tsdn,&extents_rtree,prVar15,(uintptr_t)ptr_00,true,false);
        }
      }
      large_dalloc(tsdn,(extent_t *)
                        (((long)(prVar16->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe));
      return result;
    }
    if (opt_junk_free == true) {
      memset(ptr_00,0x5a,sz_index2size_tab[binind]);
    }
    if (tcache->bins_small[(ulong)binind + 5].ncached == tcache_bin_info[binind].ncached_max) {
      tcache_bin_flush_large
                (&tsdn->tsd,tcache->bins_small + (ulong)binind + 5,binind,
                 tcache_bin_info[binind].ncached_max >> 1,tcache);
    }
    iVar3 = tcache->bins_small[(ulong)binind + 5].ncached;
    tcache->bins_small[(ulong)binind + 5].ncached = iVar3 + 1;
    tcache->bins_small[(ulong)binind + 5].avail[~(long)iVar3] = ptr_00;
    iVar3 = (tcache->gc_ticker).tick;
    (tcache->gc_ticker).tick = iVar3 + -1;
    if (0 < iVar3) {
      return result;
    }
    (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
    goto LAB_0011556d;
  }
  if (opt_junk_free == true) {
    arena_dalloc_junk_small_impl(ptr_00,bin_infos + binind);
  }
  pcVar6 = tcache_bin_info;
  uVar8 = tcache->bins_small[binind].ncached;
  if (uVar8 == tcache_bin_info[binind].ncached_max) {
    tcache_bin_flush_small
              (&tsdn->tsd,tcache,tcache->bins_small + binind,binind,
               tcache_bin_info[binind].ncached_max >> 1);
    uVar8 = tcache->bins_small[binind].ncached;
    if (uVar8 != pcVar6[binind].ncached_max) goto LAB_00115540;
  }
  else {
LAB_00115540:
    tcache->bins_small[binind].ncached = uVar8 + 1;
    tcache->bins_small[binind].avail[(int)~uVar8] = ptr_00;
  }
  iVar3 = (tcache->gc_ticker).tick;
  (tcache->gc_ticker).tick = iVar3 + -1;
  if (0 < iVar3) {
    return result;
  }
  (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
LAB_0011556d:
  tcache_event_hard(&tsdn->tsd,tcache);
  return result;
}

Assistant:

void *
large_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t usize,
    size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	extent_t *extent = iealloc(tsdn, ptr);

	size_t oldusize = extent_usize_get(extent);
	/* The following should have been caught by callers. */
	assert(usize > 0 && usize <= SC_LARGE_MAXCLASS);
	/* Both allocation sizes must be large to avoid a move. */
	assert(oldusize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS);

	/* Try to avoid moving the allocation. */
	if (!large_ralloc_no_move(tsdn, extent, usize, usize, zero)) {
		hook_invoke_expand(hook_args->is_realloc
		    ? hook_expand_realloc : hook_expand_rallocx, ptr, oldusize,
		    usize, (uintptr_t)ptr, hook_args->args);
		return extent_addr_get(extent);
	}

	/*
	 * usize and old size are different enough that we need to use a
	 * different size class.  In that case, fall back to allocating new
	 * space and copying.
	 */
	void *ret = large_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	size_t copysize = (usize < oldusize) ? usize : oldusize;
	memcpy(ret, extent_addr_get(extent), copysize);
	isdalloct(tsdn, extent_addr_get(extent), oldusize, tcache, NULL, true);
	return ret;
}